

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# qwidgettextcontrol.cpp
# Opt level: O1

void __thiscall QWidgetTextControl::ensureCursorVisible(QWidgetTextControl *this)

{
  QWidgetTextControlPrivate *this_00;
  int position;
  long in_FS_OFFSET;
  double local_68;
  double dStack_60;
  double local_58;
  double dStack_50;
  QRectF local_48;
  long local_28;
  
  local_28 = *(long *)(in_FS_OFFSET + 0x28);
  this_00 = *(QWidgetTextControlPrivate **)(this + 8);
  local_58 = -NAN;
  dStack_50 = -NAN;
  local_68 = -NAN;
  dStack_60 = -NAN;
  position = QTextCursor::position();
  QWidgetTextControlPrivate::rectForPosition(&local_48,this_00,position);
  local_68 = local_48.xp + -5.0;
  dStack_60 = local_48.yp + 0.0;
  local_58 = local_48.w + 5.0 + 5.0;
  dStack_50 = local_48.h + 0.0;
  local_48.xp = 0.0;
  local_48.yp = (qreal)&local_68;
  QMetaObject::activate((QObject *)this,&staticMetaObject,0xb,(void **)&local_48);
  QMetaObject::activate((QObject *)this,&staticMetaObject,0xc,(void **)0x0);
  if (*(long *)(in_FS_OFFSET + 0x28) == local_28) {
    return;
  }
  __stack_chk_fail();
}

Assistant:

void QWidgetTextControl::ensureCursorVisible()
{
    Q_D(QWidgetTextControl);
    QRectF crect = d->rectForPosition(d->cursor.position()).adjusted(-5, 0, 5, 0);
    emit visibilityRequest(crect);
    emit microFocusChanged();
}